

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

bool __thiscall DMenu::Responder(DMenu *this,event_t *ev)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  bool res;
  event_t *ev_local;
  DMenu *this_local;
  
  if (ev->type == '\x04') {
    if (ev->subtype == '\a') {
      bVar1 = MouseEventBack(this,0,(int)ev->data1,(int)ev->data2);
      if (bVar1) {
        ev->data2 = -1;
      }
      uVar2 = (*(this->super_DObject)._vptr_DObject[0xe])
                        (this,0,(ulong)(uint)(int)ev->data1,(ulong)(uint)(int)ev->data2);
      if (bVar1 || (uVar2 & 1) != 0) {
        SetCapture(this);
      }
    }
    else if (ev->subtype == '\x06') {
      BackbuttonTime = 0x8c;
      if ((((this->super_DObject).field_0x24 & 1) != 0) ||
         (iVar3 = FIntCVar::operator_cast_to_int(&m_use_mouse), iVar3 == 1)) {
        bVar1 = MouseEventBack(this,1,(int)ev->data1,(int)ev->data2);
        if (bVar1) {
          ev->data2 = -1;
        }
        (*(this->super_DObject)._vptr_DObject[0xe])
                  (this,1,(ulong)(uint)(int)ev->data1,(ulong)(uint)(int)ev->data2);
      }
    }
    else if ((ev->subtype == '\b') && (((this->super_DObject).field_0x24 & 1) != 0)) {
      ReleaseCapture(this);
      bVar1 = MouseEventBack(this,2,(int)ev->data1,(int)ev->data2);
      if (bVar1) {
        ev->data2 = -1;
      }
      (*(this->super_DObject)._vptr_DObject[0xe])
                (this,2,(ulong)(uint)(int)ev->data1,(ulong)(uint)(int)ev->data2);
    }
  }
  return false;
}

Assistant:

bool DMenu::Responder (event_t *ev) 
{ 
	bool res = false;
	if (ev->type == EV_GUI_Event)
	{
		if (ev->subtype == EV_GUI_LButtonDown)
		{
			res = MouseEventBack(MOUSE_Click, ev->data1, ev->data2);
			// make the menu's mouse handler believe that the current coordinate is outside the valid range
			if (res) ev->data2 = -1;	
			res |= MouseEvent(MOUSE_Click, ev->data1, ev->data2);
			if (res)
			{
				SetCapture();
			}
			
		}
		else if (ev->subtype == EV_GUI_MouseMove)
		{
			BackbuttonTime = BACKBUTTON_TIME;
			if (mMouseCapture || m_use_mouse == 1)
			{
				res = MouseEventBack(MOUSE_Move, ev->data1, ev->data2);
				if (res) ev->data2 = -1;	
				res |= MouseEvent(MOUSE_Move, ev->data1, ev->data2);
			}
		}
		else if (ev->subtype == EV_GUI_LButtonUp)
		{
			if (mMouseCapture)
			{
				ReleaseCapture();
				res = MouseEventBack(MOUSE_Release, ev->data1, ev->data2);
				if (res) ev->data2 = -1;	
				res |= MouseEvent(MOUSE_Release, ev->data1, ev->data2);
			}
		}
	}
	return false; 
}